

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

bool __thiscall cs::codecvt::gbk::is_identifier(gbk *this,char32_t ch)

{
  int iVar1;
  bool bVar2;
  iterator iVar3;
  key_arg<char32_t> local_14;
  
  iVar3 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
          ::find<char32_t>((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                            *)&compiler_type::signals,&local_14,
                           SUB168(ZEXT416((uint)ch) * ZEXT816(0xde5fb9d2630458e9),8) +
                           SUB168(ZEXT416((uint)ch) * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar3.ctrl_ == (ctrl_t *)(compiler_type::signals + DAT_00259818)) {
    if ((short)ch < 0) {
      bVar2 = ch == L'ꦖ' ||
              ((uint)(ch + L'\xffff55c0') < 0x5461 || (uint)(ch + L'\xffff7ec0') < 0x1fbf);
    }
    else {
      bVar2 = true;
      if (ch != L'_') {
        iVar1 = iswalnum(ch);
        bVar2 = iVar1 != 0;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool is_identifier(char32_t ch) override
			{
				if (compiler_type::issignal(ch))
					return false;
				/**
				 * Chinese Character in GBK Charset
				 * GBK/2: 0xB0A1 - 0xF7FE
				 * GBK/3: 0x8140 - 0xA0FE
				 * GBK/4: 0xAA40 - 0xFEA0
				 * GBK/5: 0xA996
				 */
				if (ch & u32_blck_begin)
					return (ch >= 0xB0A1 && ch <= 0xF7FE) || (ch >= 0x8140 && ch <= 0xA0FE) ||
					       (ch >= 0xAA40 && ch <= 0xFEA0) || ch == 0xA996;
				else
					return ch == '_' || std::iswalnum(ch);
			}